

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O3

void MergeRGBPlane(uint8_t *src_r,int src_stride_r,uint8_t *src_g,int src_stride_g,uint8_t *src_b,
                  int src_stride_b,uint8_t *dst_rgb,int dst_stride_rgb,int width,int height)

{
  int iVar1;
  uint uVar2;
  code *pcVar3;
  
  iVar1 = height;
  if (height < 0) {
    iVar1 = -height;
    dst_rgb = dst_rgb + ~height * dst_stride_rgb;
    dst_stride_rgb = -dst_stride_rgb;
  }
  if ((((src_stride_b == width) && (src_stride_r == width)) && (src_stride_g == width)) &&
     (dst_stride_rgb == width * 3)) {
    width = iVar1 * src_stride_r;
    src_stride_r = 0;
    src_stride_g = 0;
    src_stride_b = 0;
    dst_stride_rgb = 0;
    iVar1 = 1;
  }
  uVar2 = cpu_info_;
  if (cpu_info_ == 0) {
    uVar2 = InitCpuFlags();
  }
  if ((width & 0xfU) == 0) {
    pcVar3 = MergeRGBRow_SSSE3;
  }
  else {
    pcVar3 = MergeRGBRow_Any_SSSE3;
  }
  if ((uVar2 & 0x40) == 0) {
    pcVar3 = MergeRGBRow_C;
  }
  if (iVar1 != 0) {
    do {
      (*pcVar3)(src_r,src_g,src_b,dst_rgb,width);
      src_r = src_r + src_stride_r;
      src_g = src_g + src_stride_g;
      src_b = src_b + src_stride_b;
      dst_rgb = dst_rgb + dst_stride_rgb;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  return;
}

Assistant:

LIBYUV_API
void MergeRGBPlane(const uint8_t* src_r,
                   int src_stride_r,
                   const uint8_t* src_g,
                   int src_stride_g,
                   const uint8_t* src_b,
                   int src_stride_b,
                   uint8_t* dst_rgb,
                   int dst_stride_rgb,
                   int width,
                   int height) {
  int y;
  void (*MergeRGBRow)(const uint8_t* src_r, const uint8_t* src_g,
                      const uint8_t* src_b, uint8_t* dst_rgb, int width) =
      MergeRGBRow_C;
  // Coalesce rows.
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_rgb = dst_rgb + (height - 1) * dst_stride_rgb;
    dst_stride_rgb = -dst_stride_rgb;
  }
  // Coalesce rows.
  if (src_stride_r == width && src_stride_g == width && src_stride_b == width &&
      dst_stride_rgb == width * 3) {
    width *= height;
    height = 1;
    src_stride_r = src_stride_g = src_stride_b = dst_stride_rgb = 0;
  }
#if defined(HAS_MERGERGBROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    MergeRGBRow = MergeRGBRow_Any_SSSE3;
    if (IS_ALIGNED(width, 16)) {
      MergeRGBRow = MergeRGBRow_SSSE3;
    }
  }
#endif
#if defined(HAS_MERGERGBROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    MergeRGBRow = MergeRGBRow_Any_NEON;
    if (IS_ALIGNED(width, 16)) {
      MergeRGBRow = MergeRGBRow_NEON;
    }
  }
#endif
#if defined(HAS_MERGERGBROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    MergeRGBRow = MergeRGBRow_Any_MMI;
    if (IS_ALIGNED(width, 8)) {
      MergeRGBRow = MergeRGBRow_MMI;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    // Merge a row of U and V into a row of RGB.
    MergeRGBRow(src_r, src_g, src_b, dst_rgb, width);
    src_r += src_stride_r;
    src_g += src_stride_g;
    src_b += src_stride_b;
    dst_rgb += dst_stride_rgb;
  }
}